

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.h
# Opt level: O2

void pbrt::ErrorExit<int,float&,double_const&>
               (FileLoc *loc,char *fmt,int *args,float *args_1,double *args_2)

{
  double *in_R9;
  string local_30;
  
  StringPrintf<int,float&,double_const&>
            (&local_30,(pbrt *)fmt,(char *)args,(int *)args_1,(float *)args_2,in_R9);
  ErrorExit(loc,local_30._M_dataplus._M_p);
}

Assistant:

[[noreturn]] inline void ErrorExit(const FileLoc *loc, const char *fmt, Args &&... args) {
    ErrorExit(loc, StringPrintf(fmt, std::forward<Args>(args)...).c_str());
}